

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O3

int igsc_image_oprom_type(igsc_oprom_image *img,uint32_t *oprom_type)

{
  igsc_oprom_type iVar1;
  int iVar2;
  
  iVar2 = 3;
  if (oprom_type != (uint32_t *)0x0 && img != (igsc_oprom_image *)0x0) {
    iVar1 = image_oprom_get_type(img);
    if (iVar1 == IGSC_OPROM_NONE) {
      iVar2 = 5;
    }
    else {
      *oprom_type = iVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int igsc_image_oprom_type(IN struct igsc_oprom_image *img,
                          OUT uint32_t *oprom_type)
{
    enum igsc_oprom_type img_type;

    if (img == NULL || oprom_type == NULL)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    img_type = image_oprom_get_type(img);
    if (img_type == IGSC_OPROM_NONE)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    *oprom_type = img_type;

    return IGSC_SUCCESS;
}